

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_c.cpp
# Opt level: O0

void installCopier_c(char *typeName,MockTypeCopyFunction_c copier)

{
  MockSupport *pMVar1;
  MockCFunctionCopierNode *this;
  SimpleString local_38 [2];
  MockTypeCopyFunction_c local_18;
  MockTypeCopyFunction_c copier_local;
  char *typeName_local;
  
  local_18 = copier;
  copier_local = (MockTypeCopyFunction_c)typeName;
  this = (MockCFunctionCopierNode *)
         operator_new(0x18,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockSupport_c.cpp"
                      ,0xe4);
  MockCFunctionCopierNode::MockCFunctionCopierNode(this,copierList_,local_18);
  pMVar1 = currentMockSupport;
  copierList_ = this;
  SimpleString::SimpleString(local_38,(char *)copier_local);
  (*pMVar1->_vptr_MockSupport[0x2d])(pMVar1,local_38,copierList_);
  SimpleString::~SimpleString(local_38);
  return;
}

Assistant:

static void installCopier_c (const char* typeName, MockTypeCopyFunction_c copier)
{
    copierList_ = new MockCFunctionCopierNode(copierList_, copier);
    currentMockSupport->installCopier(typeName, *copierList_);
}